

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_double_fast.c
# Opt level: O2

size_t ZSTD_compressBlock_doubleFast
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *pInLimit;
  uint uVar1;
  uint uVar2;
  uint uVar3;
  BYTE *pBVar4;
  U32 *pUVar5;
  U32 *pUVar6;
  char cVar7;
  U32 UVar8;
  uint uVar9;
  size_t sVar10;
  long lVar11;
  byte bVar12;
  byte bVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  ulong uVar17;
  long *plVar18;
  ulong uVar19;
  uint uVar20;
  long *plVar21;
  int iVar22;
  long *plVar23;
  long *plVar24;
  long *plVar25;
  long *plVar26;
  ulong uVar27;
  uint local_a4;
  BYTE *iend;
  U32 *hashLong;
  BYTE *base;
  U32 *hashSmall;
  BYTE *ilimit;
  U32 prefixLowestIndex;
  
  pBVar4 = (ms->window).base;
  uVar9 = (ms->window).dictLimit;
  plVar21 = (long *)(pBVar4 + uVar9);
  uVar1 = *rep;
  uVar2 = rep[1];
  plVar24 = (long *)((ulong)((int)src == (int)plVar21) + (long)src);
  uVar14 = (int)plVar24 - (int)plVar21;
  local_a4 = uVar2;
  if (uVar14 < uVar2) {
    local_a4 = 0;
  }
  uVar20 = 0;
  if (uVar1 <= uVar14) {
    uVar20 = uVar1;
  }
  bVar12 = 0x40 - (char)(ms->cParams).hashLog;
  uVar15 = (ms->cParams).minMatch;
  pUVar5 = ms->hashTable;
  pUVar6 = ms->chainTable;
  pInLimit = (BYTE *)((long)src + srcSize);
  plVar18 = (long *)((long)src + (srcSize - 8));
  iVar22 = (int)pBVar4;
  cVar7 = (char)(ms->cParams).chainLog;
  if (uVar15 == 5) {
    bVar13 = 0x40 - cVar7;
    do {
      do {
        while( true ) {
          if (plVar18 <= plVar24) goto LAB_0039dc30;
          lVar11 = *plVar24;
          uVar19 = (ulong)(lVar11 * -0x30e44323485a9b9d) >> (bVar12 & 0x3f);
          uVar27 = (ulong)(lVar11 * -0x30e4432345000000) >> (bVar13 & 0x3f);
          uVar17 = (long)plVar24 - (long)pBVar4;
          uVar15 = pUVar5[uVar19];
          uVar3 = pUVar6[uVar27];
          UVar8 = (U32)uVar17;
          pUVar6[uVar27] = UVar8;
          pUVar5[uVar19] = UVar8;
          plVar23 = (long *)((long)plVar24 + 1);
          if ((uVar20 != 0) &&
             (*(int *)((long)plVar24 + -(ulong)uVar20 + 1) == *(int *)((long)plVar24 + 1))) {
            sVar10 = ZSTD_count((BYTE *)((long)plVar24 + 5),
                                (BYTE *)((long)plVar24 + -(ulong)uVar20 + 5),pInLimit);
            lVar11 = sVar10 + 4;
            ZSTD_storeSeq(seqStore,(long)plVar23 - (long)src,src,0,sVar10 + 1);
            uVar15 = uVar20;
            goto LAB_0039d746;
          }
          if ((uVar9 < uVar15) && (plVar25 = (long *)(pBVar4 + uVar15), *plVar25 == lVar11)) {
            sVar10 = ZSTD_count((BYTE *)(plVar24 + 1),(BYTE *)(plVar25 + 1),pInLimit);
            lVar11 = sVar10 + 8;
            uVar15 = (int)plVar24 - (int)plVar25;
            for (plVar23 = plVar24;
                ((plVar21 < plVar25 && (src < plVar23)) &&
                (*(char *)((long)plVar23 + -1) == *(char *)((long)plVar25 + -1)));
                plVar23 = (long *)((long)plVar23 + -1)) {
              plVar25 = (long *)((long)plVar25 + -1);
              lVar11 = lVar11 + 1;
            }
            goto LAB_0039d721;
          }
          if ((uVar9 < uVar3) &&
             (plVar25 = (long *)(pBVar4 + uVar3), (int)*plVar25 == (int)*plVar24)) break;
          plVar24 = (long *)((long)plVar24 + ((long)plVar24 - (long)src >> 8) + 1);
        }
        lVar11 = *plVar23;
        uVar19 = (ulong)(lVar11 * -0x30e44323485a9b9d) >> (bVar12 & 0x3f);
        uVar15 = pUVar5[uVar19];
        pUVar5[uVar19] = UVar8 + 1;
        if ((uVar9 < uVar15) && (plVar26 = (long *)(pBVar4 + uVar15), *plVar26 == lVar11)) {
          sVar10 = ZSTD_count((BYTE *)((long)plVar24 + 9),(BYTE *)(plVar26 + 1),pInLimit);
          lVar11 = sVar10 + 8;
          uVar15 = (int)plVar23 - (int)plVar26;
          for (; ((plVar21 < plVar26 && (src < plVar23)) &&
                 (*(char *)((long)plVar23 + -1) == *(char *)((long)plVar26 + -1)));
              plVar23 = (long *)((long)plVar23 + -1)) {
            plVar26 = (long *)((long)plVar26 + -1);
            lVar11 = lVar11 + 1;
          }
        }
        else {
          sVar10 = ZSTD_count((BYTE *)((long)plVar24 + 4),(BYTE *)((long)plVar25 + 4),pInLimit);
          lVar11 = sVar10 + 4;
          uVar15 = (int)plVar24 - (int)plVar25;
          for (; ((plVar23 = plVar24, plVar21 < plVar25 && (src < plVar24)) &&
                 (*(char *)((long)plVar24 + -1) == *(char *)((long)plVar25 + -1)));
              plVar24 = (long *)((long)plVar24 + -1)) {
            plVar25 = (long *)((long)plVar25 + -1);
            lVar11 = lVar11 + 1;
          }
        }
LAB_0039d721:
        ZSTD_storeSeq(seqStore,(long)plVar23 - (long)src,src,uVar15 + 2,lVar11 - 3);
        local_a4 = uVar20;
LAB_0039d746:
        uVar20 = uVar15;
        src = (void *)(lVar11 + (long)plVar23);
        plVar24 = (long *)src;
      } while (plVar18 < src);
      lVar11 = *(long *)(pBVar4 + (uVar17 & 0xffffffff) + 2);
      pUVar6[(ulong)(lVar11 * -0x30e4432345000000) >> (bVar13 & 0x3f)] = UVar8 + 2;
      pUVar5[(ulong)(lVar11 * -0x30e44323485a9b9d) >> (bVar12 & 0x3f)] = UVar8 + 2;
      lVar11 = *(long *)((long)src + -2);
      UVar8 = ((int)src + -2) - iVar22;
      pUVar6[(ulong)(lVar11 * -0x30e4432345000000) >> (bVar13 & 0x3f)] = UVar8;
      pUVar5[(ulong)(lVar11 * -0x30e44323485a9b9d) >> (bVar12 & 0x3f)] = UVar8;
      uVar15 = uVar20;
      for (; uVar20 = uVar15, plVar24 = (long *)src, src <= plVar18;
          src = (void *)((long)src + sVar10 + 4)) {
        if ((local_a4 == 0) || ((int)*src != *(int *)((long)src - (ulong)local_a4))) break;
        sVar10 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - (ulong)local_a4)),
                            pInLimit);
        lVar11 = *src;
        UVar8 = (int)src - iVar22;
        pUVar6[(ulong)(lVar11 * -0x30e4432345000000) >> (bVar13 & 0x3f)] = UVar8;
        pUVar5[(ulong)(lVar11 * -0x30e44323485a9b9d) >> (bVar12 & 0x3f)] = UVar8;
        ZSTD_storeSeq(seqStore,0,src,0,sVar10 + 1);
        uVar15 = local_a4;
        local_a4 = uVar20;
      }
    } while( true );
  }
  if (uVar15 == 6) {
    bVar13 = 0x40 - cVar7;
    do {
      do {
        while( true ) {
          if (plVar18 <= plVar24) goto LAB_0039dc30;
          lVar11 = *plVar24;
          uVar17 = (ulong)(lVar11 * -0x30e44323485a9b9d) >> (bVar12 & 0x3f);
          uVar19 = (ulong)(lVar11 * -0x30e4432340650000) >> (bVar13 & 0x3f);
          uVar27 = (long)plVar24 - (long)pBVar4;
          uVar15 = pUVar5[uVar17];
          uVar3 = pUVar6[uVar19];
          UVar8 = (U32)uVar27;
          pUVar6[uVar19] = UVar8;
          pUVar5[uVar17] = UVar8;
          plVar23 = (long *)((long)plVar24 + 1);
          if ((uVar20 != 0) &&
             (*(int *)((long)plVar24 + -(ulong)uVar20 + 1) == *(int *)((long)plVar24 + 1))) {
            sVar10 = ZSTD_count((BYTE *)((long)plVar24 + 5),
                                (BYTE *)((long)plVar24 + -(ulong)uVar20 + 5),pInLimit);
            lVar11 = sVar10 + 4;
            ZSTD_storeSeq(seqStore,(long)plVar23 - (long)src,src,0,sVar10 + 1);
            uVar15 = uVar20;
            goto LAB_0039d3a3;
          }
          if ((uVar9 < uVar15) && (plVar25 = (long *)(pBVar4 + uVar15), *plVar25 == lVar11)) {
            sVar10 = ZSTD_count((BYTE *)(plVar24 + 1),(BYTE *)(plVar25 + 1),pInLimit);
            lVar11 = sVar10 + 8;
            uVar15 = (int)plVar24 - (int)plVar25;
            for (plVar23 = plVar24;
                ((plVar21 < plVar25 && (src < plVar23)) &&
                (*(char *)((long)plVar23 + -1) == *(char *)((long)plVar25 + -1)));
                plVar23 = (long *)((long)plVar23 + -1)) {
              plVar25 = (long *)((long)plVar25 + -1);
              lVar11 = lVar11 + 1;
            }
            goto LAB_0039d37e;
          }
          if ((uVar9 < uVar3) &&
             (plVar25 = (long *)(pBVar4 + uVar3), (int)*plVar25 == (int)*plVar24)) break;
          plVar24 = (long *)((long)plVar24 + ((long)plVar24 - (long)src >> 8) + 1);
        }
        lVar11 = *plVar23;
        uVar17 = (ulong)(lVar11 * -0x30e44323485a9b9d) >> (bVar12 & 0x3f);
        uVar15 = pUVar5[uVar17];
        pUVar5[uVar17] = UVar8 + 1;
        if ((uVar9 < uVar15) && (plVar26 = (long *)(pBVar4 + uVar15), *plVar26 == lVar11)) {
          sVar10 = ZSTD_count((BYTE *)((long)plVar24 + 9),(BYTE *)(plVar26 + 1),pInLimit);
          lVar11 = sVar10 + 8;
          uVar15 = (int)plVar23 - (int)plVar26;
          for (; ((plVar21 < plVar26 && (src < plVar23)) &&
                 (*(char *)((long)plVar23 + -1) == *(char *)((long)plVar26 + -1)));
              plVar23 = (long *)((long)plVar23 + -1)) {
            plVar26 = (long *)((long)plVar26 + -1);
            lVar11 = lVar11 + 1;
          }
        }
        else {
          sVar10 = ZSTD_count((BYTE *)((long)plVar24 + 4),(BYTE *)((long)plVar25 + 4),pInLimit);
          lVar11 = sVar10 + 4;
          uVar15 = (int)plVar24 - (int)plVar25;
          for (; ((plVar23 = plVar24, plVar21 < plVar25 && (src < plVar24)) &&
                 (*(char *)((long)plVar24 + -1) == *(char *)((long)plVar25 + -1)));
              plVar24 = (long *)((long)plVar24 + -1)) {
            plVar25 = (long *)((long)plVar25 + -1);
            lVar11 = lVar11 + 1;
          }
        }
LAB_0039d37e:
        ZSTD_storeSeq(seqStore,(long)plVar23 - (long)src,src,uVar15 + 2,lVar11 - 3);
        local_a4 = uVar20;
LAB_0039d3a3:
        uVar20 = uVar15;
        src = (void *)(lVar11 + (long)plVar23);
        plVar24 = (long *)src;
      } while (plVar18 < src);
      lVar11 = *(long *)(pBVar4 + (uVar27 & 0xffffffff) + 2);
      pUVar6[(ulong)(lVar11 * -0x30e4432340650000) >> (bVar13 & 0x3f)] = UVar8 + 2;
      pUVar5[(ulong)(lVar11 * -0x30e44323485a9b9d) >> (bVar12 & 0x3f)] = UVar8 + 2;
      lVar11 = *(long *)((long)src + -2);
      UVar8 = ((int)src + -2) - iVar22;
      pUVar6[(ulong)(lVar11 * -0x30e4432340650000) >> (bVar13 & 0x3f)] = UVar8;
      pUVar5[(ulong)(lVar11 * -0x30e44323485a9b9d) >> (bVar12 & 0x3f)] = UVar8;
      uVar15 = uVar20;
      for (; uVar20 = uVar15, plVar24 = (long *)src, src <= plVar18;
          src = (void *)((long)src + sVar10 + 4)) {
        if ((local_a4 == 0) || ((int)*src != *(int *)((long)src - (ulong)local_a4))) break;
        sVar10 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - (ulong)local_a4)),
                            pInLimit);
        lVar11 = *src;
        UVar8 = (int)src - iVar22;
        pUVar6[(ulong)(lVar11 * -0x30e4432340650000) >> (bVar13 & 0x3f)] = UVar8;
        pUVar5[(ulong)(lVar11 * -0x30e44323485a9b9d) >> (bVar12 & 0x3f)] = UVar8;
        ZSTD_storeSeq(seqStore,0,src,0,sVar10 + 1);
        uVar15 = local_a4;
        local_a4 = uVar20;
      }
    } while( true );
  }
  if (uVar15 != 7) {
    bVar13 = 0x20 - cVar7;
    do {
      do {
        while( true ) {
          if (plVar18 <= plVar24) goto LAB_0039dc30;
          uVar19 = (ulong)(*plVar24 * -0x30e44323485a9b9d) >> (bVar12 & 0x3f);
          uVar16 = (uint)((int)*plVar24 * -0x61c8864f) >> (bVar13 & 0x1f);
          uVar17 = (long)plVar24 - (long)pBVar4;
          uVar15 = pUVar5[uVar19];
          uVar3 = pUVar6[uVar16];
          plVar23 = (long *)((long)plVar24 + 1);
          UVar8 = (U32)uVar17;
          pUVar6[uVar16] = UVar8;
          pUVar5[uVar19] = UVar8;
          if ((uVar20 != 0) &&
             (*(int *)((long)plVar24 + -(ulong)uVar20 + 1) == *(int *)((long)plVar24 + 1))) {
            sVar10 = ZSTD_count((BYTE *)((long)plVar24 + 5),
                                (BYTE *)((long)plVar24 + -(ulong)uVar20 + 5),pInLimit);
            lVar11 = sVar10 + 4;
            ZSTD_storeSeq(seqStore,(long)plVar23 - (long)src,src,0,sVar10 + 1);
            uVar15 = uVar20;
            goto LAB_0039dada;
          }
          if ((uVar9 < uVar15) && (plVar25 = (long *)(pBVar4 + uVar15), *plVar25 == *plVar24)) {
            sVar10 = ZSTD_count((BYTE *)(plVar24 + 1),(BYTE *)(plVar25 + 1),pInLimit);
            lVar11 = sVar10 + 8;
            uVar15 = (int)plVar24 - (int)plVar25;
            for (plVar23 = plVar24;
                ((plVar21 < plVar25 && (src < plVar23)) &&
                (*(char *)((long)plVar23 + -1) == *(char *)((long)plVar25 + -1)));
                plVar23 = (long *)((long)plVar23 + -1)) {
              plVar25 = (long *)((long)plVar25 + -1);
              lVar11 = lVar11 + 1;
            }
            goto LAB_0039dab7;
          }
          if ((uVar9 < uVar3) &&
             (plVar25 = (long *)(pBVar4 + uVar3), (int)*plVar25 == (int)*plVar24)) break;
          plVar24 = (long *)((long)plVar24 + ((long)plVar24 - (long)src >> 8) + 1);
        }
        lVar11 = *plVar23;
        uVar19 = (ulong)(lVar11 * -0x30e44323485a9b9d) >> (bVar12 & 0x3f);
        uVar15 = pUVar5[uVar19];
        pUVar5[uVar19] = UVar8 + 1;
        if ((uVar9 < uVar15) && (plVar26 = (long *)(pBVar4 + uVar15), *plVar26 == lVar11)) {
          sVar10 = ZSTD_count((BYTE *)((long)plVar24 + 9),(BYTE *)(plVar26 + 1),pInLimit);
          lVar11 = sVar10 + 8;
          uVar15 = (int)plVar23 - (int)plVar26;
          for (; ((plVar21 < plVar26 && (src < plVar23)) &&
                 (*(char *)((long)plVar23 + -1) == *(char *)((long)plVar26 + -1)));
              plVar23 = (long *)((long)plVar23 + -1)) {
            plVar26 = (long *)((long)plVar26 + -1);
            lVar11 = lVar11 + 1;
          }
        }
        else {
          sVar10 = ZSTD_count((BYTE *)((long)plVar24 + 4),(BYTE *)((long)plVar25 + 4),pInLimit);
          lVar11 = sVar10 + 4;
          uVar15 = (int)plVar24 - (int)plVar25;
          for (; ((plVar23 = plVar24, plVar21 < plVar25 && (src < plVar24)) &&
                 (*(char *)((long)plVar24 + -1) == *(char *)((long)plVar25 + -1)));
              plVar24 = (long *)((long)plVar24 + -1)) {
            plVar25 = (long *)((long)plVar25 + -1);
            lVar11 = lVar11 + 1;
          }
        }
LAB_0039dab7:
        ZSTD_storeSeq(seqStore,(long)plVar23 - (long)src,src,uVar15 + 2,lVar11 - 3);
        local_a4 = uVar20;
LAB_0039dada:
        uVar20 = uVar15;
        src = (void *)(lVar11 + (long)plVar23);
        plVar24 = (long *)src;
      } while (plVar18 < src);
      uVar17 = uVar17 & 0xffffffff;
      pUVar6[(uint)(*(int *)(pBVar4 + uVar17 + 2) * -0x61c8864f) >> (bVar13 & 0x1f)] = UVar8 + 2;
      pUVar5[(ulong)(*(long *)(pBVar4 + uVar17 + 2) * -0x30e44323485a9b9d) >> (bVar12 & 0x3f)] =
           UVar8 + 2;
      UVar8 = ((int)src + -2) - iVar22;
      pUVar6[(uint)(*(int *)((long)src + -2) * -0x61c8864f) >> (bVar13 & 0x1f)] = UVar8;
      pUVar5[(ulong)(*(long *)((long)src + -2) * -0x30e44323485a9b9d) >> (bVar12 & 0x3f)] = UVar8;
      uVar15 = uVar20;
      for (; uVar20 = uVar15, plVar24 = (long *)src, src <= plVar18;
          src = (void *)((long)src + sVar10 + 4)) {
        lVar11 = *src;
        if ((local_a4 == 0) || ((int)lVar11 != *(int *)((long)src - (ulong)local_a4))) break;
        sVar10 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - (ulong)local_a4)),
                            pInLimit);
        UVar8 = (int)src - iVar22;
        pUVar6[(uint)((int)lVar11 * -0x61c8864f) >> (bVar13 & 0x1f)] = UVar8;
        pUVar5[(ulong)(*src * -0x30e44323485a9b9d) >> (bVar12 & 0x3f)] = UVar8;
        ZSTD_storeSeq(seqStore,0,src,0,sVar10 + 1);
        uVar15 = local_a4;
        local_a4 = uVar20;
      }
    } while( true );
  }
  bVar13 = 0x40 - cVar7;
LAB_0039cdc8:
  do {
    if (plVar18 <= plVar24) {
LAB_0039dc30:
      uVar9 = 0;
      if (uVar14 < uVar2) {
        uVar9 = uVar2;
      }
      if (uVar14 < uVar1) {
        uVar9 = uVar1;
      }
      if (uVar20 == 0) {
        uVar20 = uVar9;
      }
      if (local_a4 != 0) {
        uVar9 = local_a4;
      }
      *rep = uVar20;
      rep[1] = uVar9;
      return (long)pInLimit - (long)src;
    }
    lVar11 = *plVar24;
    uVar17 = (ulong)(lVar11 * -0x30e44323485a9b9d) >> (bVar12 & 0x3f);
    uVar19 = (ulong)(lVar11 * -0x30e44323405a9d00) >> (bVar13 & 0x3f);
    uVar27 = (long)plVar24 - (long)pBVar4;
    uVar15 = pUVar5[uVar17];
    uVar3 = pUVar6[uVar19];
    UVar8 = (U32)uVar27;
    pUVar6[uVar19] = UVar8;
    pUVar5[uVar17] = UVar8;
    plVar23 = (long *)((long)plVar24 + 1);
    if ((uVar20 != 0) &&
       (*(int *)((long)plVar24 + -(ulong)uVar20 + 1) == *(int *)((long)plVar24 + 1))) {
      sVar10 = ZSTD_count((BYTE *)((long)plVar24 + 5),(BYTE *)((long)plVar24 + -(ulong)uVar20 + 5),
                          pInLimit);
      lVar11 = sVar10 + 4;
      ZSTD_storeSeq(seqStore,(long)plVar23 - (long)src,src,0,sVar10 + 1);
      uVar15 = uVar20;
      goto LAB_0039cff4;
    }
    if ((uVar9 < uVar15) && (plVar25 = (long *)(pBVar4 + uVar15), *plVar25 == lVar11)) {
      sVar10 = ZSTD_count((BYTE *)(plVar24 + 1),(BYTE *)(plVar25 + 1),pInLimit);
      lVar11 = sVar10 + 8;
      uVar15 = (int)plVar24 - (int)plVar25;
      for (plVar23 = plVar24;
          ((plVar21 < plVar25 && (src < plVar23)) &&
          (*(char *)((long)plVar23 + -1) == *(char *)((long)plVar25 + -1)));
          plVar23 = (long *)((long)plVar23 + -1)) {
        plVar25 = (long *)((long)plVar25 + -1);
        lVar11 = lVar11 + 1;
      }
      goto LAB_0039cfcf;
    }
    if ((uVar9 < uVar3) && (plVar25 = (long *)(pBVar4 + uVar3), (int)*plVar25 == (int)*plVar24))
    break;
    plVar24 = (long *)((long)plVar24 + ((long)plVar24 - (long)src >> 8) + 1);
  } while( true );
  lVar11 = *plVar23;
  uVar17 = (ulong)(lVar11 * -0x30e44323485a9b9d) >> (bVar12 & 0x3f);
  uVar15 = pUVar5[uVar17];
  pUVar5[uVar17] = UVar8 + 1;
  if ((uVar9 < uVar15) && (plVar26 = (long *)(pBVar4 + uVar15), *plVar26 == lVar11)) {
    sVar10 = ZSTD_count((BYTE *)((long)plVar24 + 9),(BYTE *)(plVar26 + 1),pInLimit);
    lVar11 = sVar10 + 8;
    uVar15 = (int)plVar23 - (int)plVar26;
    for (; ((plVar21 < plVar26 && (src < plVar23)) &&
           (*(char *)((long)plVar23 + -1) == *(char *)((long)plVar26 + -1)));
        plVar23 = (long *)((long)plVar23 + -1)) {
      plVar26 = (long *)((long)plVar26 + -1);
      lVar11 = lVar11 + 1;
    }
  }
  else {
    sVar10 = ZSTD_count((BYTE *)((long)plVar24 + 4),(BYTE *)((long)plVar25 + 4),pInLimit);
    lVar11 = sVar10 + 4;
    uVar15 = (int)plVar24 - (int)plVar25;
    for (; ((plVar23 = plVar24, plVar21 < plVar25 && (src < plVar24)) &&
           (*(char *)((long)plVar24 + -1) == *(char *)((long)plVar25 + -1)));
        plVar24 = (long *)((long)plVar24 + -1)) {
      plVar25 = (long *)((long)plVar25 + -1);
      lVar11 = lVar11 + 1;
    }
  }
LAB_0039cfcf:
  ZSTD_storeSeq(seqStore,(long)plVar23 - (long)src,src,uVar15 + 2,lVar11 - 3);
  local_a4 = uVar20;
LAB_0039cff4:
  uVar20 = uVar15;
  src = (void *)(lVar11 + (long)plVar23);
  plVar24 = (long *)src;
  if (src <= plVar18) {
    lVar11 = *(long *)(pBVar4 + (uVar27 & 0xffffffff) + 2);
    pUVar6[(ulong)(lVar11 * -0x30e44323405a9d00) >> (bVar13 & 0x3f)] = UVar8 + 2;
    pUVar5[(ulong)(lVar11 * -0x30e44323485a9b9d) >> (bVar12 & 0x3f)] = UVar8 + 2;
    lVar11 = *(long *)((long)src + -2);
    UVar8 = ((int)src + -2) - iVar22;
    pUVar6[(ulong)(lVar11 * -0x30e44323405a9d00) >> (bVar13 & 0x3f)] = UVar8;
    pUVar5[(ulong)(lVar11 * -0x30e44323485a9b9d) >> (bVar12 & 0x3f)] = UVar8;
    uVar15 = uVar20;
    for (; uVar20 = uVar15, plVar24 = (long *)src, src <= plVar18;
        src = (void *)((long)src + sVar10 + 4)) {
      if ((local_a4 == 0) || ((int)*src != *(int *)((long)src - (ulong)local_a4))) break;
      sVar10 = ZSTD_count((BYTE *)((long)src + 4),(BYTE *)((long)src + (4 - (ulong)local_a4)),
                          pInLimit);
      lVar11 = *src;
      UVar8 = (int)src - iVar22;
      pUVar6[(ulong)(lVar11 * -0x30e44323405a9d00) >> (bVar13 & 0x3f)] = UVar8;
      pUVar5[(ulong)(lVar11 * -0x30e44323485a9b9d) >> (bVar12 & 0x3f)] = UVar8;
      ZSTD_storeSeq(seqStore,0,src,0,sVar10 + 1);
      uVar15 = local_a4;
      local_a4 = uVar20;
    }
  }
  goto LAB_0039cdc8;
}

Assistant:

size_t ZSTD_compressBlock_doubleFast(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    const U32 mls = ms->cParams.minMatch;
    switch(mls)
    {
    default: /* includes case 3 */
    case 4 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 4, ZSTD_noDict);
    case 5 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 5, ZSTD_noDict);
    case 6 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 6, ZSTD_noDict);
    case 7 :
        return ZSTD_compressBlock_doubleFast_generic(ms, seqStore, rep, src, srcSize, 7, ZSTD_noDict);
    }
}